

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvs.c
# Opt level: O2

LispPTR values_list(int arg_count,LispPTR *args)

{
  byte bVar1;
  FX2 *pFVar2;
  ByteCode *pBVar3;
  uint uVar4;
  LispPTR LVar5;
  FX2 *frame;
  fnhead *pfVar6;
  fnhead *pfVar7;
  ByteCode *pBVar8;
  int unbind_count;
  FX2 *pFVar9;
  FX2 *local_38;
  
  pFVar9 = (FX2 *)(MachineState.pvar + -10);
  local_38 = (FX2 *)0x0;
  unbind_count = 0;
  pFVar2 = pFVar9;
LAB_00128339:
  frame = pFVar2;
  if (frame == pFVar9) {
    pBVar8 = MachineState.currentpc + 3;
    pfVar6 = MachineState.currentfunc;
    goto LAB_00128371;
  }
  pfVar6 = (fnhead *)NativeAligned4FromLAddr(frame->fnheader & 0xfffffff);
  pBVar8 = (ByteCode *)(ulong)frame->pc;
  pfVar7 = pfVar6;
LAB_001283fe:
  do {
    pBVar8 = pBVar8 + (long)pfVar7;
LAB_00128371:
    for (; bVar1 = *(byte *)((ulong)pBVar8 ^ 3), bVar1 != 0xb0; pBVar8 = pBVar8 + 1) {
      if (bVar1 == 0xb1) {
        bVar1 = *(byte *)((ulong)(pBVar8 + 1) ^ 3);
        uVar4 = (uint)bVar1 * 0x100 + -0x10000 + (uint)*(byte *)((ulong)(pBVar8 + 2) ^ 3);
        if (-1 < (char)bVar1) {
          uVar4 = (uint)CONCAT11(bVar1,*(byte *)((ulong)(pBVar8 + 2) ^ 3));
        }
        pfVar7 = (fnhead *)(long)(int)uVar4;
        goto LAB_001283fe;
      }
      if (bVar1 == 9) {
        if (MVLIST_index ==
            ((uint)*(byte *)((ulong)(pBVar8 + 4) ^ 3) |
            (uint)*(byte *)((ulong)(pBVar8 + 3) ^ 3) << 8 |
            (uint)*(byte *)((ulong)(pBVar8 + 2) ^ 3) << 0x10 |
            (uint)*(byte *)((ulong)(pBVar8 + 1) ^ 3) << 0x18)) {
          if (0 < unbind_count) {
            simulate_unbind(frame,unbind_count,local_38);
          }
          pBVar3 = pBVar8 + 2;
          if (frame != pFVar9) {
            frame->pc = ((short)pBVar8 - (short)pfVar6) + 5;
            pBVar3 = MachineState.currentpc;
          }
          MachineState.currentpc = pBVar3;
          return *args;
        }
LAB_00128494:
        uVar4 = *args;
        if ((*(ushort *)((ulong)(uVar4 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 5) {
          return uVar4;
        }
        LVar5 = car(uVar4);
        return LVar5;
      }
      if (bVar1 == 0x3f) {
LAB_00128406:
        pFVar2 = (FX2 *)(Stackspace +
                        ((ulong)*(ushort *)
                                 ((long)&frame->alink + (ulong)((*(uint *)frame & 1) << 4)) - 10));
        local_38 = frame;
        goto LAB_00128339;
      }
      if (bVar1 != 0x12) {
        if (bVar1 == 0x10) goto LAB_00128406;
        if (-0x71 < (char)bVar1) goto LAB_00128494;
        pfVar7 = (fnhead *)(ulong)(bVar1 + 2 & 0x1f);
        goto LAB_001283fe;
      }
      unbind_count = unbind_count + 1;
    }
    bVar1 = *(byte *)((ulong)(pBVar8 + 1) ^ 3);
    pfVar7 = (fnhead *)(ulong)bVar1 + -0x10;
    if (-1 < (char)bVar1) {
      pfVar7 = (fnhead *)(ulong)bVar1;
    }
  } while( true );
}

Assistant:

LispPTR values_list(int arg_count, LispPTR *args) {
  FX2 *caller, *prevcaller = 0, *immediate_caller = 0;
  ByteCode *pc;
  int unbind_count = 0;
  struct fnhead *fnhead;
  short opcode;

  caller = (FX2 *)CURRENTFX;
  immediate_caller = caller;

newframe:
  if (caller == immediate_caller) {
    fnhead = (struct fnhead *)FuncObj;
    pc = (ByteCode *)PC + 3; /* Skip over the miscn opcode we're in now */
  } else {
    fnhead = (struct fnhead *)NativeAligned4FromLAddr(POINTERMASK & SWA_FNHEAD((int)caller->fnheader));
    pc = (ByteCode *)fnhead + (caller->pc);
  }

#ifdef RESWAPPEDCODESTREAM
  if (!fnhead->byteswapped) {
    byte_swap_code_block(fnhead);
    fnhead->byteswapped = 1;
  }
#endif /* RESWAPPEDCODESTREAM */

newpc:
  opcode = (short)((unsigned char)GETBYTE((char *)pc));
  switch (opcode) {
    case opc_RETURN:
    case opc_SLRETURN:
      prevcaller = caller;
      caller = (FX2 *)(Stackspace + (int)(GETCLINK(caller)));
      goto newframe;

    case opc_FN1:
      if (MVLIST_index == Get_code_AtomNo(pc + 1)) {
        if (unbind_count > 0) simulate_unbind(caller, unbind_count, prevcaller);
/* would add 3 to PC, but miscn ret code does. */
#ifndef BIGATOMS
        if (caller == immediate_caller) PC = pc;
#else
        /* BUT 3's not enough for big atoms, so add 1 */
        if (caller == immediate_caller) PC = pc + (FN_OPCODE_SIZE - 3);
#endif /* BIGATOMS */

        else
          caller->pc = (UNSIGNED)pc + FN_OPCODE_SIZE - (UNSIGNED)fnhead;
        return (args[0]);
      }
      break;

    case opc_UNBIND:
      pc += 1;
      unbind_count += 1;
      goto newpc;

    case opc_JUMPX: {
      short displacement;
      displacement = (short)(GETBYTE((char *)pc + 1));
      if (displacement >= 128) displacement -= 256;
      pc += displacement;
      goto newpc;
    }

    case opc_JUMPXX: {
      int displacement;
      displacement = (int)Get_code_DLword(pc + 1);
      if (displacement >= 32768) displacement -= 65536;
      pc += displacement;
      goto newpc;
    }
    default:
      if ((opcode >= opc_JUMP) && (opcode < opc_FJUMP)) {
        pc += 2 + opcode - opc_JUMP;
        goto newpc;
      }
  }

  /*****************************************/
  /* Default case:  Return a single value. */
  /*****************************************/

  if (Listp(args[0]))
    return (car(args[0]));
  else
    return (args[0]);
}